

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

int32_t u_memcmp_63(UChar *buf1,UChar *buf2,int32_t count)

{
  int32_t result;
  UChar *limit;
  UChar *pUStack_20;
  int32_t count_local;
  UChar *buf2_local;
  UChar *buf1_local;
  
  if (0 < count) {
    pUStack_20 = buf2;
    for (buf2_local = buf1; buf2_local < buf1 + count; buf2_local = buf2_local + 1) {
      if ((uint)(ushort)*buf2_local - (uint)(ushort)*pUStack_20 != 0) {
        return (uint)(ushort)*buf2_local - (uint)(ushort)*pUStack_20;
      }
      pUStack_20 = pUStack_20 + 1;
    }
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_memcmp(const UChar *buf1, const UChar *buf2, int32_t count) {
    if(count > 0) {
        const UChar *limit = buf1 + count;
        int32_t result;

        while (buf1 < limit) {
            result = (int32_t)(uint16_t)*buf1 - (int32_t)(uint16_t)*buf2;
            if (result != 0) {
                return result;
            }
            buf1++;
            buf2++;
        }
    }
    return 0;
}